

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int CMcontrol_list_poll(CMControlList cl)

{
  int iVar1;
  int in_EAX;
  int extraout_EAX;
  func_entry *pfVar2;
  
  pfVar2 = cl->polling_function_list;
  while( true ) {
    if (pfVar2 == (func_entry *)0x0) {
      return in_EAX;
    }
    if (pfVar2->func == (CMPollFunc)0x0) break;
    iVar1 = cl->cl_consistency_number;
    IntCManager_unlock(pfVar2->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x285);
    (*pfVar2->func)(pfVar2->cm,pfVar2->client_data);
    IntCManager_lock(pfVar2->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0x287);
    pfVar2 = pfVar2 + 1;
    in_EAX = extraout_EAX;
    if (iVar1 != cl->cl_consistency_number) {
      return extraout_EAX;
    }
  }
  return in_EAX;
}

Assistant:

static int
CMcontrol_list_poll(CMControlList cl)
{
    func_entry *poll_list = cl->polling_function_list;
    while ((poll_list != NULL) && (poll_list->func != NULL)){
	int consistency_number = cl->cl_consistency_number;

	CManager_unlock(poll_list->cm);
	poll_list->func(poll_list->cm, poll_list->client_data);
	CManager_lock(poll_list->cm);
	/* do function */
	if (consistency_number != cl->cl_consistency_number) {
	    return 1;
	}
	poll_list++;
    }
    return 1;
}